

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

void bssl::ssl_session_renew_timeout(SSL *ssl,SSL_SESSION *session,uint32_t timeout)

{
  ssl_session_rebase_time(ssl,session);
  if (session->timeout <= timeout) {
    if (session->auth_timeout < timeout) {
      timeout = session->auth_timeout;
    }
    session->timeout = timeout;
  }
  return;
}

Assistant:

void ssl_session_renew_timeout(SSL *ssl, SSL_SESSION *session,
                               uint32_t timeout) {
  // Rebase the timestamp relative to the current time so |timeout| is measured
  // correctly.
  ssl_session_rebase_time(ssl, session);

  if (session->timeout > timeout) {
    return;
  }

  session->timeout = timeout;
  if (session->timeout > session->auth_timeout) {
    session->timeout = session->auth_timeout;
  }
}